

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O1

int mbedtls_ssl_read_record(mbedtls_ssl_context *ssl,uint update_hs_digest)

{
  uint8_t uVar1;
  mbedtls_ssl_handshake_params *pmVar2;
  byte *pbVar3;
  uchar *puVar4;
  bool bVar5;
  bool bVar6;
  size_t __n;
  byte bVar7;
  int iVar8;
  int iVar9;
  ushort uVar10;
  uint uVar11;
  uint uVar12;
  size_t __n_00;
  byte *pbVar13;
  mbedtls_ssl_hs_buffer *pmVar14;
  char *pcVar15;
  long lVar16;
  ulong uVar17;
  ulong offset;
  uchar *puVar18;
  char *pcVar19;
  uint uVar20;
  char *in_stack_ffffffffffffff58;
  undefined4 uVar21;
  ulong in_stack_ffffffffffffff60;
  int local_80;
  mbedtls_record local_78;
  uchar *local_48;
  char *local_40;
  mbedtls_ssl_hs_buffer *local_38;
  
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
             ,0x101a,"=> read record");
  if (ssl->keep_current_message == 0) {
    do {
      uVar17 = ssl->in_hslen;
      if (uVar17 == 0) {
        iVar8 = 0;
        bVar5 = true;
        if (ssl->in_offt == (uchar *)0x0) {
          ssl->in_msglen = 0;
        }
      }
      else if (ssl->in_offt == (uchar *)0x0) {
        __n_00 = ssl->in_msglen - uVar17;
        if (ssl->in_msglen < uVar17 || __n_00 == 0) {
          ssl->in_msglen = 0;
        }
        else {
          ssl->in_msglen = __n_00;
          memmove(ssl->in_msg,ssl->in_msg + uVar17,__n_00);
          in_stack_ffffffffffffff58 = (char *)ssl->in_msglen;
          mbedtls_debug_print_buf
                    (ssl,4,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                     ,0x11fd,"remaining content in record",ssl->in_msg,
                     (size_t)in_stack_ffffffffffffff58);
        }
        ssl->in_hslen = 0;
        iVar8 = 0;
        bVar5 = true;
      }
      else {
        bVar5 = false;
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,0x11de,"should never happen");
        iVar8 = -0x6c00;
      }
      if (!bVar5) {
        return iVar8;
      }
      if (ssl->in_msglen == 0) {
        if (((ssl->conf->transport == '\x01') && (ssl->in_left <= ssl->next_record_offset)) &&
           (pmVar2 = ssl->handshake, pmVar2 != (mbedtls_ssl_handshake_params *)0x0)) {
          mbedtls_debug_print_msg
                    (ssl,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                     ,0x107d,"=> ssl_load_buffered_message");
          if ((ssl->state == 10) || (ssl->state == 0xc)) {
            if ((pmVar2->buffering).seen_ccs == '\0') {
              mbedtls_debug_print_msg
                        (ssl,2,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                         ,0x1084,"CCS not seen in the current flight");
              goto LAB_0020d291;
            }
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                       ,0x1089,"Injecting buffered CCS message");
            ssl->in_msgtype = 0x14;
            ssl->in_msglen = 1;
            *ssl->in_msg = '\x01';
            ssl->in_left = 0;
            ssl->next_record_offset = 0;
            (pmVar2->buffering).seen_ccs = '\0';
          }
          else {
            iVar8 = 1;
            lVar16 = 0;
            do {
              bVar7 = (&(pmVar2->buffering).hs[1].field_0x0)[lVar16];
              if ((bVar7 & 1) != 0) {
                in_stack_ffffffffffffff58 = "fully";
                if ((bVar7 & 4) == 0) {
                  in_stack_ffffffffffffff58 = "partially";
                }
                mbedtls_debug_print_msg
                          (ssl,2,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                           ,0x109f,"Future message with sequence number %u %s buffered.",
                           (ulong)(pmVar2->in_msg_seq + iVar8),in_stack_ffffffffffffff58);
              }
              lVar16 = lVar16 + 0x18;
              iVar8 = iVar8 + 1;
            } while (lVar16 != 0x48);
            if ((~*(byte *)(pmVar2->buffering).hs & 5) != 0) {
              mbedtls_debug_print_msg
                        (ssl,2,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                         ,0x10c2,"Next handshake message %u not or only partially bufffered",
                         (ulong)pmVar2->in_msg_seq);
LAB_0020d291:
              mbedtls_debug_print_msg
                        (ssl,2,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                         ,0x10c9,"<= ssl_load_buffered_message");
              goto LAB_0020d2af;
            }
            puVar18 = (pmVar2->buffering).hs[0].data;
            uVar17 = (ulong)puVar18[3] | (ulong)((uint)puVar18[2] << 8 | (uint)puVar18[1] << 0x10);
            if (uVar17 < 0x3f5) {
              pcVar15 = (char *)(uVar17 + 0xc);
              mbedtls_debug_print_msg
                        (ssl,2,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                         ,0x10b5,"Next handshake message has been buffered - load");
              in_stack_ffffffffffffff58 = pcVar15;
              mbedtls_debug_print_buf
                        (ssl,3,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                         ,0x10b7,"Buffered handshake message (incl. header)",
                         (pmVar2->buffering).hs[0].data,(size_t)pcVar15);
              ssl->in_msgtype = 0x16;
              ssl->in_hslen = (size_t)pcVar15;
              ssl->in_msglen = (size_t)pcVar15;
              memcpy(ssl->in_msg,(pmVar2->buffering).hs[0].data,(size_t)pcVar15);
            }
            else {
              mbedtls_debug_print_msg
                        (ssl,1,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                         ,0x10b1,"should never happen");
            }
            if (0x3f4 < (uint)uVar17) goto LAB_0020d2af;
          }
          mbedtls_debug_print_msg
                    (ssl,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                     ,0x10c9,"<= ssl_load_buffered_message");
LAB_0020d44c:
          iVar8 = 0;
          iVar9 = 0;
        }
        else {
LAB_0020d2af:
          pmVar2 = ssl->handshake;
          iVar8 = 0;
          bVar5 = true;
          if (((pmVar2 != (mbedtls_ssl_handshake_params *)0x0 && ssl->conf->transport == '\x01') &&
              (puVar18 = (pmVar2->buffering).future_record.data, puVar18 != (uchar *)0x0)) &&
             (ssl->in_left <= ssl->next_record_offset)) {
            local_38 = (mbedtls_ssl_hs_buffer *)(pmVar2->buffering).future_record.len;
            uVar12 = (pmVar2->buffering).future_record.epoch;
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                       ,0x124e,"=> ssl_load_buffered_record");
            if (uVar12 == ssl->in_epoch) {
              mbedtls_debug_print_msg
                        (ssl,2,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                         ,0x1255,"Found buffered record from current epoch - load");
              pmVar14 = local_38;
              if (ssl->in_buf + (0x42d - (long)ssl->in_hdr) < local_38) {
                bVar5 = false;
                mbedtls_debug_print_msg
                          (ssl,1,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                           ,0x1259,"should never happen");
                iVar8 = -0x6c00;
                goto LAB_0020d3f3;
              }
              memcpy(ssl->in_hdr,puVar18,(size_t)local_38);
              ssl->in_left = (size_t)pmVar14;
              ssl->next_record_offset = 0;
              ssl_free_buffered_record(ssl);
            }
            else {
              mbedtls_debug_print_msg
                        (ssl,2,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                         ,0x1251,"Buffered record not from current epoch.");
            }
            iVar8 = 0;
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                       ,0x1264,"<= ssl_load_buffered_record");
          }
LAB_0020d3f3:
          if (bVar5) {
            iVar8 = mbedtls_ssl_fetch_input(ssl,(ulong)(ssl->conf->transport == '\x01') * 8 + 5);
            if (iVar8 == 0) {
              iVar8 = ssl_parse_record_header(ssl,ssl->in_hdr,ssl->in_left,&local_78);
              uVar1 = ssl->conf->transport;
              if (iVar8 == 0) {
                if (uVar1 == '\x01') {
                  ssl->next_record_offset = local_78.buf_len;
                  if (local_78.buf_len < (char *)ssl->in_left) {
                    mbedtls_debug_print_msg
                              (ssl,3,
                               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                               ,0x1300,"more than one record within datagram");
                  }
                }
                else {
                  iVar8 = mbedtls_ssl_fetch_input(ssl,local_78.buf_len);
                  if (iVar8 != 0) {
                    iVar9 = 0x130a;
                    goto LAB_0020d42f;
                  }
                  ssl->in_left = 0;
                }
                in_stack_ffffffffffffff58 = (char *)local_78.buf_len;
                mbedtls_debug_print_buf
                          (ssl,4,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                           ,0xf89,"input record from network",local_78.buf,local_78.buf_len);
                uVar1 = local_78.type;
                if (ssl->transform_in == (mbedtls_ssl_transform *)0x0) {
LAB_0020d8fb:
                  if (ssl->conf->transport == '\x01') {
                    mbedtls_ssl_dtls_replay_update(ssl);
                  }
                  iVar8 = 0;
                  if ((char *)0x400 < local_78.data_len) {
                    mbedtls_debug_print_msg
                              (ssl,1,
                               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                               ,0xffe,"bad message length");
                    iVar8 = -0x7200;
                  }
                }
                else {
                  iVar8 = mbedtls_ssl_decrypt_buf(ssl,ssl->transform_in,&local_78);
                  if (iVar8 == 0) {
                    if (uVar1 != local_78.type) {
                      mbedtls_debug_print_msg
                                (ssl,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                                 ,0xfae,"record type after decrypt (before %d): %d",(ulong)uVar1,
                                 CONCAT44((int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                                          (uint)local_78.type));
                    }
                    in_stack_ffffffffffffff58 = (char *)local_78.data_len;
                    mbedtls_debug_print_buf
                              (ssl,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                               ,0xfb2,"input payload after decrypt",
                               local_78.buf + local_78.data_offset,local_78.data_len);
                    if ((char *)local_78.data_len == (char *)0x0) {
                      if ((ssl->tls_version == MBEDTLS_SSL_VERSION_TLS1_2) &&
                         (local_78.type != 0x17)) {
                        bVar5 = false;
                        mbedtls_debug_print_msg
                                  (ssl,1,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                                   ,0xfc7,"invalid zero-length message type: %d",
                                   (ulong)(uint)ssl->in_msgtype);
                        iVar8 = -0x7200;
                      }
                      else {
                        iVar8 = ssl->nb_zero;
                        ssl->nb_zero = iVar8 + 1;
                        if (iVar8 < 3) goto LAB_0020dab5;
                        bVar5 = false;
                        mbedtls_debug_print_msg
                                  (ssl,1,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                                   ,0xfd4,
                                   "received four consecutive empty messages, possible DoS attack");
                        iVar8 = -0x7180;
                      }
                    }
                    else {
                      ssl->nb_zero = 0;
LAB_0020dab5:
                      bVar5 = true;
                      iVar8 = -0x6b80;
                      if (ssl->conf->transport != '\x01') {
                        uVar12 = 7;
                        do {
                          uVar11 = uVar12 + 1;
                          if (uVar11 <= (uint)(ssl->conf->transport == '\x01') * 2) break;
                          uVar17 = (ulong)uVar12;
                          uVar12 = uVar12 - 1;
                          puVar18 = ssl->in_ctr + uVar17;
                          *puVar18 = *puVar18 + '\x01';
                        } while (*puVar18 == '\0');
                        if ((uint)(ssl->conf->transport == '\x01') * 2 == uVar11) {
                          bVar5 = false;
                          mbedtls_debug_print_msg
                                    (ssl,1,
                                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                                     ,0xfee,"incoming message counter would wrap");
                        }
                      }
                    }
                  }
                  else {
                    mbedtls_debug_print_ret
                              (ssl,1,
                               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                               ,0xf9e,"ssl_decrypt_buf",iVar8);
                    bVar5 = false;
                  }
                  if (bVar5) goto LAB_0020d8fb;
                }
                uVar1 = ssl->conf->transport;
                if (iVar8 == 0) {
                  pbVar3 = ssl->in_hdr;
                  uVar17 = (ulong)(uVar1 == '\x01');
                  pbVar13 = pbVar3 + -8;
                  if (uVar1 == '\x01') {
                    pbVar13 = pbVar3 + 3;
                  }
                  ssl->in_ctr = pbVar13;
                  ssl->in_len = pbVar3 + uVar17 * 8 + 3;
                  ssl->in_msg = pbVar3 + uVar17 * 8 + 5;
                  ssl->in_iv = pbVar3 + uVar17 * 8 + 5;
                  ssl->in_msgtype = (uint)local_78.type;
                  *pbVar3 = local_78.type;
                  ssl->in_msg = local_78.buf + local_78.data_offset;
                  ssl->in_msglen = local_78.data_len;
                  *(ushort *)ssl->in_len =
                       (ushort)local_78.data_len << 8 | (ushort)local_78.data_len >> 8;
                  iVar8 = 0;
                }
                else if (iVar8 == -0x7180 && uVar1 == '\x01') {
                  iVar8 = -0x7180;
                  if ((ssl->state != 0xb) && (ssl->state != 0xd)) {
                    uVar12 = ssl->conf->badmac_limit;
                    if ((uVar12 == 0) ||
                       (uVar11 = ssl->badmac_seen + 1, ssl->badmac_seen = uVar11, uVar11 < uVar12))
                    {
                      ssl->next_record_offset = 0;
                      ssl->in_left = 0;
                      iVar8 = 0x1335;
                      pcVar15 = "discarding invalid record (mac)";
                      goto LAB_0020deec;
                    }
                    mbedtls_debug_print_msg
                              (ssl,1,
                               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                               ,0x132b,"too many records with bad MAC");
                  }
                }
              }
              else {
                if (uVar1 != '\x01') goto LAB_0020d43e;
                if (iVar8 == -0x6480) {
                  pmVar2 = ssl->handshake;
                  iVar8 = -0x6700;
                  if (((pmVar2 != (mbedtls_ssl_handshake_params *)0x0) && (local_78.type == 0x16))
                     && ((pmVar2->buffering).future_record.data == (uchar *)0x0)) {
                    uVar17 = (pmVar2->buffering).total_bytes_buffered;
                    if ((char *)(0x8000 - uVar17) < local_78.buf_len) {
                      in_stack_ffffffffffffff58 = (char *)0x0;
                      mbedtls_debug_print_msg
                                (ssl,2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                                 ,0x1286,
                                 "Buffering of future epoch record of size %zu would exceed the compile-time limit %zu (already %zu bytes buffered) -- ignore\n"
                                 ,local_78.buf_len,0x8000,uVar17);
                      in_stack_ffffffffffffff60 = uVar17;
                    }
                    else {
                      mbedtls_debug_print_msg
                                (ssl,2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                                 ,0x128c,"Buffer record from epoch %u",(ulong)(ssl->in_epoch + 1));
                      in_stack_ffffffffffffff58 = (char *)local_78.buf_len;
                      mbedtls_debug_print_buf
                                (ssl,3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                                 ,0x128d,"Buffered record",local_78.buf,local_78.buf_len);
                      __n = local_78.buf_len;
                      (pmVar2->buffering).future_record.epoch = ssl->in_epoch + 1;
                      (pmVar2->buffering).future_record.len = local_78.buf_len;
                      puVar18 = (uchar *)calloc(1,local_78.buf_len);
                      (pmVar2->buffering).future_record.data = puVar18;
                      if (puVar18 != (uchar *)0x0) {
                        memcpy(puVar18,local_78.buf,__n);
                        (pmVar2->buffering).total_bytes_buffered =
                             (size_t)(__n + (pmVar2->buffering).total_bytes_buffered);
                      }
                    }
                  }
                }
                if (iVar8 == -0x6700) {
                  ssl->next_record_offset = local_78.buf_len;
                  iVar8 = 0x12e8;
                  pcVar15 = "discarding unexpected record (header)";
                }
                else {
                  ssl->next_record_offset = 0;
                  ssl->in_left = 0;
                  iVar8 = 0x12ef;
                  pcVar15 = "discarding invalid record (header)";
                }
LAB_0020deec:
                mbedtls_debug_print_msg
                          (ssl,1,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                           ,iVar8,pcVar15);
                iVar8 = -0x6580;
              }
            }
            else {
              iVar9 = 0x12bc;
LAB_0020d42f:
              mbedtls_debug_print_ret
                        (ssl,1,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                         ,iVar9,"mbedtls_ssl_fetch_input",iVar8);
            }
          }
LAB_0020d43e:
          if (iVar8 == -0x6580) {
            iVar9 = 3;
          }
          else {
            if (iVar8 == 0) goto LAB_0020d44c;
            iVar9 = 1;
            mbedtls_debug_print_ret
                      (ssl,1,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                       ,0x1039,"ssl_get_next_record",iVar8);
            local_80 = iVar8;
          }
        }
        if (iVar9 != 3) {
          if (iVar9 != 0) {
            return local_80;
          }
          goto LAB_0020d49c;
        }
      }
      else {
LAB_0020d49c:
        iVar8 = mbedtls_ssl_handle_message_type(ssl);
        if (iVar8 == -0x6480) {
          pmVar2 = ssl->handshake;
          if (pmVar2 == (mbedtls_ssl_handshake_params *)0x0) {
            iVar9 = 0;
          }
          else {
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                       ,0x1101,"=> ssl_buffer_message");
            if (ssl->in_msgtype == 0x16) {
              uVar10 = *(ushort *)(ssl->in_msg + 4) << 8 | *(ushort *)(ssl->in_msg + 4) >> 8;
              uVar12 = ssl->handshake->in_msg_seq;
              uVar11 = (uint)uVar10;
              uVar20 = uVar11 - uVar12;
              if (uVar11 < uVar12) {
                iVar8 = 0;
                bVar5 = false;
                mbedtls_debug_print_msg
                          (ssl,1,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                           ,0x1114,"should never happen");
                uVar17 = in_stack_ffffffffffffff60;
              }
              else {
                uVar21 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20);
                if (uVar20 < 4) {
                  pcVar15 = (char *)ssl->in_hslen;
                  local_40 = pcVar15 + -0xc;
                  in_stack_ffffffffffffff58 = (char *)CONCAT44(uVar21,uVar20);
                  local_48 = (uchar *)CONCAT44(local_48._4_4_,uVar11);
                  mbedtls_debug_print_msg
                            (ssl,2,
                             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                             ,0x1126,"Buffering HS message with sequence number %u, offset %u ",
                             (ulong)uVar10,in_stack_ffffffffffffff58);
                  pmVar14 = (pmVar2->buffering).hs + uVar20;
                  bVar7 = *(byte *)pmVar14;
                  if ((bVar7 & 1) == 0) {
                    local_38 = pmVar14;
                    iVar8 = ssl_hs_is_proper_fragment(ssl);
                    *(byte *)local_38 = bVar7 & 0xfc | (char)iVar8 * '\x02';
                    if ((char *)0x400 < pcVar15) {
                      iVar8 = 0;
                      pcVar19 = in_stack_ffffffffffffff58;
                      uVar17 = in_stack_ffffffffffffff60;
                      goto LAB_0020d738;
                    }
                    uVar17 = (pmVar2->buffering).total_bytes_buffered;
                    if (uVar17 < 0x8001) {
                      pcVar19 = pcVar15;
                      if (iVar8 != 0) {
                        pcVar19 = pcVar15 + ((((ulong)local_40 >> 3) + 1) -
                                            (ulong)(((ulong)local_40 & 7) == 0));
                      }
                      if ((char *)(0x8000 - uVar17) < pcVar19) {
                        if ((uint)local_48 == uVar12) {
                          in_stack_ffffffffffffff58 = (char *)0x8000;
                          mbedtls_debug_print_msg
                                    (ssl,2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                                     ,0x115d,
                                     "Buffering of future message of size %zu would exceed the compile-time limit %zu (already %zu bytes buffered) -- attempt to make space by freeing buffered future messages\n"
                                     ,local_40,0x8000,uVar17);
                          iVar8 = ssl_buffer_make_space(ssl,(size_t)pcVar19);
                          in_stack_ffffffffffffff60 = uVar17;
                          if (iVar8 == 0) goto LAB_0020dbfd;
                          uVar17 = 0;
                          mbedtls_debug_print_msg
                                    (ssl,2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                                     ,0x116d,
                                     "Reassembly of next message of size %zu (%zu with bitmap) would exceed the compile-time limit %zu (already %zu bytes buffered) -- fail\n"
                                     ,local_40,pcVar19,0x8000,
                                     (pmVar2->buffering).total_bytes_buffered);
                          iVar8 = -0x6a00;
                        }
                        else {
                          pcVar19 = (char *)0x0;
                          mbedtls_debug_print_msg
                                    (ssl,2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                                     ,0x1152,
                                     "Buffering of future message of size %zu would exceed the compile-time limit %zu (already %zu bytes buffered) -- ignore\n"
                                     ,local_40,0x8000,uVar17);
                          iVar8 = 0;
                        }
                      }
                      else {
LAB_0020dbfd:
                        uVar17 = in_stack_ffffffffffffff60;
                        iVar8 = 0;
                        mbedtls_debug_print_msg
                                  (ssl,2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                                   ,0x1176,"initialize reassembly, total length = %zu",local_40,
                                   in_stack_ffffffffffffff58);
                        puVar18 = (uchar *)calloc(1,(size_t)pcVar19);
                        local_38->data = puVar18;
                        if (puVar18 != (uchar *)0x0) {
                          local_38->data_len = (size_t)pcVar19;
                          puVar4 = ssl->in_msg;
                          *(undefined2 *)(puVar18 + 4) = *(undefined2 *)(puVar4 + 4);
                          *(undefined4 *)puVar18 = *(undefined4 *)puVar4;
                          puVar18 = local_38->data;
                          puVar18[8] = '\0';
                          puVar18[6] = '\0';
                          puVar18[7] = '\0';
                          puVar18 = local_38->data;
                          puVar18[0xb] = puVar18[3];
                          *(undefined2 *)(puVar18 + 9) = *(undefined2 *)(puVar18 + 1);
                          *(byte *)local_38 = *(byte *)local_38 | 1;
                          (pmVar2->buffering).total_bytes_buffered =
                               (size_t)(pcVar19 + (pmVar2->buffering).total_bytes_buffered);
                          bVar6 = true;
                          bVar5 = false;
                          goto LAB_0020dc89;
                        }
                        iVar8 = -0x7f00;
                        pcVar19 = in_stack_ffffffffffffff58;
                      }
LAB_0020d738:
                      bVar6 = false;
                      bVar5 = true;
                      in_stack_ffffffffffffff58 = pcVar19;
                    }
                    else {
                      bVar5 = false;
                      mbedtls_debug_print_msg
                                (ssl,1,
                                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                                 ,0x113e,"should never happen");
                      bVar6 = false;
                      iVar8 = 0;
                      uVar17 = in_stack_ffffffffffffff60;
                    }
LAB_0020dc89:
                    pmVar14 = local_38;
                    if (!bVar6) goto LAB_0020d7ab;
                  }
                  else {
                    if (*(int *)(pmVar2->buffering).hs[uVar20].data != *(int *)ssl->in_msg) {
                      mbedtls_debug_print_msg
                                (ssl,1,
                                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                                 ,0x118b,"Fragment header mismatch - ignore");
                      uVar17 = in_stack_ffffffffffffff60;
                      goto LAB_0020d7a5;
                    }
                    iVar8 = 0;
                    uVar17 = in_stack_ffffffffffffff60;
                  }
                  bVar5 = true;
                  if ((undefined1  [24])((undefined1  [24])*pmVar14 & (undefined1  [24])0x4) ==
                      (undefined1  [24])0x0) {
                    local_48 = pmVar14->data;
                    puVar18 = ssl->in_msg;
                    offset = (ulong)puVar18[8] |
                             (ulong)((uint)puVar18[7] << 8 | (uint)puVar18[6] << 0x10);
                    pcVar19 = (char *)((ulong)puVar18[0xb] |
                                      (ulong)((uint)puVar18[10] << 8 | (uint)puVar18[9] << 0x10));
                    in_stack_ffffffffffffff58 = pcVar19;
                    local_38 = pmVar14;
                    mbedtls_debug_print_msg
                              (ssl,2,
                               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                               ,0x11a0,"adding fragment, offset = %zu, length = %zu",offset,pcVar19)
                    ;
                    memcpy(local_48 + offset + 0xc,ssl->in_msg + 0xc,(size_t)pcVar19);
                    if ((*(byte *)local_38 & 2) == 0) {
                      bVar7 = *(byte *)local_38 | 4;
                    }
                    else {
                      puVar18 = (uchar *)(pcVar15 + (long)local_48);
                      ssl_bitmask_set(puVar18,offset,(size_t)pcVar19);
                      iVar9 = ssl_bitmask_check(puVar18,(size_t)local_40);
                      bVar7 = *(byte *)local_38 & 0xfb | (iVar9 == 0) << 2;
                    }
                    *(byte *)local_38 = bVar7;
                    pcVar15 = anon_var_dwarf_6723d3 + 9;
                    if ((bVar7 & 4) == 0) {
                      pcVar15 = "not yet ";
                    }
                    bVar5 = true;
                    mbedtls_debug_print_msg
                              (ssl,2,
                               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                               ,0x11ad,"message %scomplete",pcVar15,in_stack_ffffffffffffff58);
                  }
                }
                else {
                  uVar17 = CONCAT44((int)(in_stack_ffffffffffffff60 >> 0x20),uVar12 + 3);
                  in_stack_ffffffffffffff58 = (char *)CONCAT44(uVar21,uVar12);
                  mbedtls_debug_print_msg
                            (ssl,2,
                             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                             ,0x1120,
                             "Ignore future HS message with sequence number %u, buffering window %u - %u"
                             ,(ulong)uVar10,in_stack_ffffffffffffff58,uVar17);
LAB_0020d7a5:
                  iVar8 = 0;
                  bVar5 = true;
                }
              }
LAB_0020d7ab:
              iVar9 = -0x6c00;
              in_stack_ffffffffffffff60 = uVar17;
              if (!bVar5) goto LAB_0020d7d8;
            }
            else {
              uVar17 = in_stack_ffffffffffffff60;
              iVar8 = 0;
              if (ssl->in_msgtype == 0x14) {
                mbedtls_debug_print_msg
                          (ssl,2,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                           ,0x1105,"Remember CCS message");
                (pmVar2->buffering).seen_ccs = '\x01';
                uVar17 = in_stack_ffffffffffffff60;
                iVar8 = 0;
              }
            }
            iVar9 = iVar8;
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                       ,0x11ba,"<= ssl_buffer_message");
            in_stack_ffffffffffffff60 = uVar17;
          }
LAB_0020d7d8:
          iVar8 = -0x6580;
          if (iVar9 != 0) {
            return iVar9;
          }
        }
      }
    } while ((iVar8 == -0x6680) || (iVar8 == -0x6580));
    if (iVar8 != 0) {
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                 ,0x1051,"mbedtls_ssl_handle_message_type",iVar8);
      return iVar8;
    }
    if (((update_hs_digest == 1) && (ssl->in_msgtype == 0x16)) &&
       (iVar8 = mbedtls_ssl_update_handshake_status(ssl), iVar8 != 0)) {
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                 ,0x1059,"mbedtls_ssl_update_handshake_status",iVar8);
      return iVar8;
    }
  }
  else {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,0x105e,"reuse previously read message");
    ssl->keep_current_message = 0;
  }
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
             ,0x1062,"<= read record");
  return 0;
}

Assistant:

int mbedtls_ssl_read_record(mbedtls_ssl_context *ssl,
                            unsigned update_hs_digest)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    MBEDTLS_SSL_DEBUG_MSG(2, ("=> read record"));

    if (ssl->keep_current_message == 0) {
        do {

            ret = ssl_consume_current_message(ssl);
            if (ret != 0) {
                return ret;
            }

            if (ssl_record_is_in_progress(ssl) == 0) {
                int dtls_have_buffered = 0;
#if defined(MBEDTLS_SSL_PROTO_DTLS)

                /* We only check for buffered messages if the
                 * current datagram is fully consumed. */
                if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
                    ssl_next_record_is_in_datagram(ssl) == 0) {
                    if (ssl_load_buffered_message(ssl) == 0) {
                        dtls_have_buffered = 1;
                    }
                }

#endif /* MBEDTLS_SSL_PROTO_DTLS */
                if (dtls_have_buffered == 0) {
                    ret = ssl_get_next_record(ssl);
                    if (ret == MBEDTLS_ERR_SSL_CONTINUE_PROCESSING) {
                        continue;
                    }

                    if (ret != 0) {
                        MBEDTLS_SSL_DEBUG_RET(1, ("ssl_get_next_record"), ret);
                        return ret;
                    }
                }
            }

            ret = mbedtls_ssl_handle_message_type(ssl);

#if defined(MBEDTLS_SSL_PROTO_DTLS)
            if (ret == MBEDTLS_ERR_SSL_EARLY_MESSAGE) {
                /* Buffer future message */
                ret = ssl_buffer_message(ssl);
                if (ret != 0) {
                    return ret;
                }

                ret = MBEDTLS_ERR_SSL_CONTINUE_PROCESSING;
            }
#endif /* MBEDTLS_SSL_PROTO_DTLS */

        } while (MBEDTLS_ERR_SSL_NON_FATAL           == ret  ||
                 MBEDTLS_ERR_SSL_CONTINUE_PROCESSING == ret);

        if (0 != ret) {
            MBEDTLS_SSL_DEBUG_RET(1, ("mbedtls_ssl_handle_message_type"), ret);
            return ret;
        }

        if (ssl->in_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE &&
            update_hs_digest == 1) {
            ret = mbedtls_ssl_update_handshake_status(ssl);
            if (0 != ret) {
                MBEDTLS_SSL_DEBUG_RET(1, ("mbedtls_ssl_update_handshake_status"), ret);
                return ret;
            }
        }
    } else {
        MBEDTLS_SSL_DEBUG_MSG(2, ("reuse previously read message"));
        ssl->keep_current_message = 0;
    }

    MBEDTLS_SSL_DEBUG_MSG(2, ("<= read record"));

    return 0;
}